

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_16x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  ulong *puVar1;
  undefined8 *puVar2;
  code *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong *puVar7;
  int8_t *piVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar24 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  int iStack_60;
  int iStack_5c;
  code *local_58;
  int32_t *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  piVar8 = av1_fwd_txfm_shift_ls[0xe];
  bVar17 = 0xf < tx_type;
  uVar9 = 0x7f1f >> (tx_type & 0x1f);
  puVar1 = (ulong *)(input + 8);
  puVar13 = puVar1;
  if ((uVar9 & 1) != 0 || bVar17) {
    puVar13 = (ulong *)input;
  }
  puVar15 = puVar13 + 1;
  puVar7 = (ulong *)input;
  puVar14 = puVar1;
  if ((uVar9 & 1) != 0 || bVar17) {
    puVar15 = (ulong *)input;
    puVar7 = puVar1;
    puVar14 = puVar13 + 1;
  }
  uVar16 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  uVar12 = 0xbeaf >> (tx_type & 0x1f);
  iVar11 = (int)*av1_fwd_txfm_shift_ls[0xe];
  lVar10 = (long)stride;
  if ((uVar12 & 1) == 0 && !bVar17) {
    local_158._0_8_ = *(ulong *)((long)puVar15 + (long)(stride * 3) * 2);
    local_148._0_8_ = *(ulong *)((long)puVar15 + (long)(stride * 2) * 2);
    local_138._0_8_ = *(ulong *)((long)puVar15 + lVar10 * 2);
  }
  else {
    local_158._0_8_ = *puVar15;
    local_148._0_8_ = *(ulong *)((long)puVar15 + lVar10 * 2);
    local_138._0_8_ = *(ulong *)((long)puVar15 + (long)(stride * 2) * 2);
    puVar15 = (ulong *)((long)puVar15 + (long)(stride * 3) * 2);
  }
  local_138._8_8_ = 0;
  local_148._8_8_ = 0;
  local_158._8_8_ = 0;
  pcVar3 = *(code **)((long)col_highbd_txfm4x4_arr + uVar16);
  local_58 = *(code **)((long)row_highbd_txfm8x16_arr + uVar16);
  local_128._0_8_ = *puVar15;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_128._0_8_;
  if ((uVar9 & 1) == 0 && !bVar17) {
    auVar19 = pshuflw(auVar18,local_158,0x1b);
    local_158._0_8_ = auVar19._0_8_;
    auVar19 = pshuflw(auVar19,local_148,0x1b);
    local_148._0_8_ = auVar19._0_8_;
    auVar19 = pshuflw(auVar19,local_138,0x1b);
    local_138._0_8_ = auVar19._0_8_;
    auVar18 = pshuflw(auVar19,auVar18,0x1b);
    local_128._0_8_ = auVar18._0_8_;
  }
  auVar18 = pmovsxwd(in_XMM1,local_158._0_8_);
  auVar19 = pmovsxwd(in_XMM2,local_148._0_8_);
  auVar23 = pmovsxwd(in_XMM3,local_138._0_8_);
  auVar24 = pmovsxwd(in_XMM4,local_128._0_8_);
  local_158._4_4_ = auVar18._4_4_;
  local_158._0_4_ = auVar18._0_4_ << iVar11;
  local_158._8_4_ = auVar18._8_4_;
  local_158._12_4_ = auVar18._12_4_;
  local_148._0_4_ = auVar19._0_4_ << iVar11;
  local_148._4_4_ = auVar19._4_4_;
  local_148._8_4_ = auVar19._8_4_;
  local_148._12_4_ = auVar19._12_4_;
  local_138._0_4_ = auVar23._0_4_ << iVar11;
  local_138._4_4_ = auVar23._4_4_;
  local_138._8_4_ = auVar23._8_4_;
  local_138._12_4_ = auVar23._12_4_;
  local_128._0_4_ = auVar24._0_4_ << iVar11;
  local_128._4_4_ = auVar24._4_4_;
  local_128._8_4_ = auVar24._8_4_;
  local_128._12_4_ = auVar24._12_4_;
  if ((uVar12 & 1) == 0 && !bVar17) {
    local_118._0_8_ = *(ulong *)((long)puVar14 + (long)(stride * 3) * 2);
    local_108._0_8_ = *(ulong *)((long)puVar14 + (long)(stride * 2) * 2);
    local_f8._0_8_ = *(ulong *)((long)puVar14 + lVar10 * 2);
  }
  else {
    local_118._0_8_ = *puVar14;
    local_108._0_8_ = *(ulong *)((long)puVar14 + lVar10 * 2);
    local_f8._0_8_ = *(ulong *)((long)puVar14 + (long)(stride * 2) * 2);
    puVar14 = (ulong *)((long)puVar14 + (long)(stride * 3) * 2);
  }
  local_f8._8_8_ = 0;
  local_108._8_8_ = 0;
  local_118._8_8_ = 0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *puVar14;
  if ((uVar9 & 1) == 0 && !bVar17) {
    auVar18 = pshuflw(auVar19,local_118,0x1b);
    local_118._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_108,0x1b);
    local_108._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_f8,0x1b);
    local_f8._0_8_ = auVar18._0_8_;
    auVar19 = pshuflw(auVar18,auVar19,0x1b);
  }
  auVar18 = pmovsxwd(auVar19,local_118._0_8_);
  auVar23 = pmovsxwd(local_148,local_108._0_8_);
  auVar24 = pmovsxwd(local_138,local_f8._0_8_);
  local_e8._0_8_ = auVar19._0_8_;
  auVar19 = pmovsxwd(local_128,local_e8._0_8_);
  local_118._4_4_ = auVar18._4_4_;
  local_118._0_4_ = auVar18._0_4_ << iVar11;
  local_118._8_4_ = auVar18._8_4_;
  local_118._12_4_ = auVar18._12_4_;
  local_108._0_4_ = auVar23._0_4_ << iVar11;
  local_108._4_4_ = auVar23._4_4_;
  local_108._8_4_ = auVar23._8_4_;
  local_108._12_4_ = auVar23._12_4_;
  local_f8._0_4_ = auVar24._0_4_ << iVar11;
  local_f8._4_4_ = auVar24._4_4_;
  local_f8._8_4_ = auVar24._8_4_;
  local_f8._12_4_ = auVar24._12_4_;
  local_e8._0_4_ = auVar19._0_4_ << iVar11;
  local_e8._4_4_ = auVar19._4_4_;
  local_e8._8_4_ = auVar19._8_4_;
  local_e8._12_4_ = auVar19._12_4_;
  puVar13 = puVar7 + 1;
  if ((uVar9 & 1) != 0 || bVar17) {
    puVar13 = puVar1;
    input = (int16_t *)(puVar7 + 1);
  }
  if ((uVar12 & 1) == 0 && !bVar17) {
    local_d8._0_8_ = *(ulong *)((long)puVar13 + (long)(stride * 3) * 2);
    local_c8._0_8_ = *(ulong *)((long)puVar13 + (long)(stride * 2) * 2);
    local_b8._0_8_ = *(ulong *)((long)puVar13 + lVar10 * 2);
  }
  else {
    local_d8._0_8_ = *puVar13;
    local_c8._0_8_ = *(ulong *)((long)puVar13 + lVar10 * 2);
    local_b8._0_8_ = *(ulong *)((long)puVar13 + (long)(stride * 2) * 2);
    puVar13 = (ulong *)((long)puVar13 + (long)(stride * 3) * 2);
  }
  local_b8._8_8_ = 0;
  local_c8._8_8_ = 0;
  local_d8._8_8_ = 0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *puVar13;
  if ((uVar9 & 1) == 0 && !bVar17) {
    auVar18 = pshuflw(auVar23,local_d8,0x1b);
    local_d8._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_c8,0x1b);
    local_c8._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_b8,0x1b);
    local_b8._0_8_ = auVar18._0_8_;
    auVar23 = pshuflw(auVar18,auVar23,0x1b);
  }
  auVar18 = pmovsxwd(auVar23,local_d8._0_8_);
  auVar19 = pmovsxwd(local_108,local_c8._0_8_);
  auVar24 = pmovsxwd(local_f8,local_b8._0_8_);
  local_a8._0_8_ = auVar23._0_8_;
  auVar23 = pmovsxwd(local_e8,local_a8._0_8_);
  local_d8._4_4_ = auVar18._4_4_;
  local_d8._0_4_ = auVar18._0_4_ << iVar11;
  local_d8._8_4_ = auVar18._8_4_;
  local_d8._12_4_ = auVar18._12_4_;
  local_c8._0_4_ = auVar19._0_4_ << iVar11;
  local_c8._4_4_ = auVar19._4_4_;
  local_c8._8_4_ = auVar19._8_4_;
  local_c8._12_4_ = auVar19._12_4_;
  local_b8._0_4_ = auVar24._0_4_ << iVar11;
  local_b8._4_4_ = auVar24._4_4_;
  local_b8._8_4_ = auVar24._8_4_;
  local_b8._12_4_ = auVar24._12_4_;
  local_a8._0_4_ = auVar23._0_4_ << iVar11;
  local_a8._4_4_ = auVar23._4_4_;
  local_a8._8_4_ = auVar23._8_4_;
  local_a8._12_4_ = auVar23._12_4_;
  if ((uVar12 & 1) == 0 && !bVar17) {
    local_98._0_8_ = *(ulong *)((long)input + (long)(stride * 3) * 2);
    local_88._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    local_78._0_8_ = *(ulong *)((long)input + lVar10 * 2);
  }
  else {
    local_98._0_8_ = *(undefined8 *)input;
    local_88._0_8_ = *(ulong *)((long)input + lVar10 * 2);
    local_78._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    input = (int16_t *)((long)input + (long)(stride * 3) * 2);
  }
  local_78._8_8_ = 0;
  local_88._8_8_ = 0;
  local_98._8_8_ = 0;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)input;
  if ((uVar9 & 1) == 0 && !bVar17) {
    auVar18 = pshuflw(auVar24,local_98,0x1b);
    local_98._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_88,0x1b);
    local_88._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_78,0x1b);
    local_78._0_8_ = auVar18._0_8_;
    auVar24 = pshuflw(auVar18,auVar24,0x1b);
  }
  auVar18 = pmovsxwd(auVar24,local_98._0_8_);
  auVar19 = pmovsxwd(local_c8,local_88._0_8_);
  auVar23 = pmovsxwd(local_b8,local_78._0_8_);
  local_68 = auVar24._0_8_;
  auVar24 = pmovsxwd(local_a8,local_68);
  local_98._4_4_ = auVar18._4_4_;
  local_98._0_4_ = auVar18._0_4_ << iVar11;
  local_98._8_4_ = auVar18._8_4_;
  local_98._12_4_ = auVar18._12_4_;
  local_88._4_4_ = auVar19._4_4_;
  local_88._0_4_ = auVar19._0_4_ << iVar11;
  local_88._8_4_ = auVar19._8_4_;
  local_88._12_4_ = auVar19._12_4_;
  local_78._4_4_ = auVar23._4_4_;
  local_78._0_4_ = auVar23._0_4_ << iVar11;
  local_78._8_4_ = auVar23._8_4_;
  local_78._12_4_ = auVar23._12_4_;
  local_68._4_4_ = auVar24._4_4_;
  local_68._0_4_ = auVar24._0_4_ << iVar11;
  iStack_60 = auVar24._8_4_;
  iStack_5c = auVar24._12_4_;
  lVar10 = 0;
  local_50 = coeff;
  do {
    puVar2 = (undefined8 *)(local_158 + lVar10);
    (*pcVar3)(puVar2,puVar2,0xd,1);
    uVar4 = *(undefined4 *)(local_148 + lVar10 + 4);
    uVar6 = *(undefined4 *)(local_138 + lVar10 + 4);
    uVar5 = *(undefined4 *)(local_128 + lVar10 + 4);
    auVar20._0_8_ =
         CONCAT44(*(undefined4 *)(local_148 + lVar10 + 8),*(undefined4 *)(local_158 + lVar10 + 8));
    auVar20._8_4_ = *(undefined4 *)(local_158 + lVar10 + 0xc);
    auVar20._12_4_ = *(undefined4 *)(local_148 + lVar10 + 0xc);
    auVar22._0_8_ =
         CONCAT44(*(undefined4 *)(local_128 + lVar10 + 8),*(undefined4 *)(local_138 + lVar10 + 8));
    auVar22._8_4_ = *(undefined4 *)(local_138 + lVar10 + 0xc);
    auVar22._12_4_ = *(undefined4 *)(local_128 + lVar10 + 0xc);
    *puVar2 = CONCAT44(*(undefined4 *)(local_148 + lVar10),*(undefined4 *)puVar2);
    *(ulong *)(local_158 + lVar10 + 8) =
         CONCAT44(*(undefined4 *)(local_128 + lVar10),*(undefined4 *)(local_138 + lVar10));
    *(undefined4 *)(local_148 + lVar10 + 8) = *(undefined4 *)(local_158 + lVar10 + 4);
    *(undefined4 *)(local_148 + lVar10 + 0xc) = uVar4;
    *(undefined4 *)(local_138 + lVar10) = uVar6;
    *(undefined4 *)(local_138 + lVar10 + 4) = uVar5;
    *(undefined8 *)(local_138 + lVar10) = auVar20._0_8_;
    *(undefined8 *)(local_138 + lVar10 + 8) = auVar22._0_8_;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._0_8_ = auVar20._8_8_;
    *(undefined1 (*) [16])(local_128 + lVar10) = auVar21;
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0x100);
  iVar11 = 1 << (~piVar8[1] & 0x1fU);
  local_48 = local_118._0_4_ + iVar11;
  iStack_44 = local_118._4_4_ + iVar11;
  iStack_40 = local_118._8_4_ + iVar11;
  iStack_3c = local_118._12_4_ + iVar11;
  auVar18 = ZEXT416((uint)-(int)piVar8[1]);
  local_158._4_4_ = local_158._4_4_ + iVar11 >> auVar18;
  local_158._0_4_ = local_158._0_4_ + iVar11 >> auVar18;
  local_158._8_4_ = local_158._8_4_ + iVar11 >> auVar18;
  local_158._12_4_ = local_158._12_4_ + iVar11 >> auVar18;
  local_148._4_4_ = local_148._4_4_ + iVar11 >> auVar18;
  local_148._0_4_ = local_148._0_4_ + iVar11 >> auVar18;
  local_148._8_4_ = local_148._8_4_ + iVar11 >> auVar18;
  local_148._12_4_ = local_148._12_4_ + iVar11 >> auVar18;
  local_138._4_4_ = local_138._4_4_ + iVar11 >> auVar18;
  local_138._0_4_ = local_138._0_4_ + iVar11 >> auVar18;
  local_138._8_4_ = local_138._8_4_ + iVar11 >> auVar18;
  local_138._12_4_ = local_138._12_4_ + iVar11 >> auVar18;
  local_128._4_4_ = local_128._4_4_ + iVar11 >> auVar18;
  local_128._0_4_ = local_128._0_4_ + iVar11 >> auVar18;
  local_128._8_4_ = local_128._8_4_ + iVar11 >> auVar18;
  local_128._12_4_ = local_128._12_4_ + iVar11 >> auVar18;
  local_118._4_4_ = iStack_44 >> auVar18;
  local_118._0_4_ = local_48 >> auVar18;
  local_118._8_4_ = iStack_40 >> auVar18;
  local_118._12_4_ = iStack_3c >> auVar18;
  local_108._4_4_ = local_108._4_4_ + iVar11 >> auVar18;
  local_108._0_4_ = local_108._0_4_ + iVar11 >> auVar18;
  local_108._8_4_ = local_108._8_4_ + iVar11 >> auVar18;
  local_108._12_4_ = local_108._12_4_ + iVar11 >> auVar18;
  local_f8._4_4_ = local_f8._4_4_ + iVar11 >> auVar18;
  local_f8._0_4_ = local_f8._0_4_ + iVar11 >> auVar18;
  local_f8._8_4_ = local_f8._8_4_ + iVar11 >> auVar18;
  local_f8._12_4_ = local_f8._12_4_ + iVar11 >> auVar18;
  local_e8._4_4_ = local_e8._4_4_ + iVar11 >> auVar18;
  local_e8._0_4_ = local_e8._0_4_ + iVar11 >> auVar18;
  local_e8._8_4_ = local_e8._8_4_ + iVar11 >> auVar18;
  local_e8._12_4_ = local_e8._12_4_ + iVar11 >> auVar18;
  local_d8._4_4_ = local_d8._4_4_ + iVar11 >> auVar18;
  local_d8._0_4_ = local_d8._0_4_ + iVar11 >> auVar18;
  local_d8._8_4_ = local_d8._8_4_ + iVar11 >> auVar18;
  local_d8._12_4_ = local_d8._12_4_ + iVar11 >> auVar18;
  local_c8._4_4_ = local_c8._4_4_ + iVar11 >> auVar18;
  local_c8._0_4_ = local_c8._0_4_ + iVar11 >> auVar18;
  local_c8._8_4_ = local_c8._8_4_ + iVar11 >> auVar18;
  local_c8._12_4_ = local_c8._12_4_ + iVar11 >> auVar18;
  local_b8._4_4_ = local_b8._4_4_ + iVar11 >> auVar18;
  local_b8._0_4_ = local_b8._0_4_ + iVar11 >> auVar18;
  local_b8._8_4_ = local_b8._8_4_ + iVar11 >> auVar18;
  local_b8._12_4_ = local_b8._12_4_ + iVar11 >> auVar18;
  local_a8._4_4_ = local_a8._4_4_ + iVar11 >> auVar18;
  local_a8._0_4_ = local_a8._0_4_ + iVar11 >> auVar18;
  local_a8._8_4_ = local_a8._8_4_ + iVar11 >> auVar18;
  local_a8._12_4_ = local_a8._12_4_ + iVar11 >> auVar18;
  local_98._4_4_ = local_98._4_4_ + iVar11 >> auVar18;
  local_98._0_4_ = local_98._0_4_ + iVar11 >> auVar18;
  local_98._8_4_ = local_98._8_4_ + iVar11 >> auVar18;
  local_98._12_4_ = local_98._12_4_ + iVar11 >> auVar18;
  local_88._4_4_ = local_88._4_4_ + iVar11 >> auVar18;
  local_88._0_4_ = local_88._0_4_ + iVar11 >> auVar18;
  local_88._8_4_ = local_88._8_4_ + iVar11 >> auVar18;
  local_88._12_4_ = local_88._12_4_ + iVar11 >> auVar18;
  local_78._4_4_ = local_78._4_4_ + iVar11 >> auVar18;
  local_78._0_4_ = local_78._0_4_ + iVar11 >> auVar18;
  local_78._8_4_ = local_78._8_4_ + iVar11 >> auVar18;
  local_78._12_4_ = local_78._12_4_ + iVar11 >> auVar18;
  local_68._4_4_ = iVar11 + local_68._4_4_ >> auVar18;
  local_68._0_4_ = iVar11 + (int)local_68 >> auVar18;
  iStack_60 = iVar11 + iStack_60 >> auVar18;
  iStack_5c = iVar11 + iStack_5c >> auVar18;
  (*local_58)(local_158,local_50,0xd,1);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x4_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int txfm_size_col = tx_size_wide[TX_16X4];
  const int txfm_size_row = tx_size_high[TX_16X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // col transform
  load_buffer_16x4(input, in, stride, ud_flip, lr_flip, shift[0]);

  for (int i = 0; i < (txfm_size_col >> 2); i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_8x8_rounding(in, -shift[1]);

  // row transform
  row_txfm(in, outcoeff128, bitrow, 1);
  (void)bd;
}